

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall
IRBuilder::BuildProfiledReg1Unsigned1
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot R0,int32 C1,ProfileId profileId)

{
  undefined1 *puVar1;
  StackSym *pSVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  ValueType VVar6;
  undefined4 *puVar7;
  RegOpnd *pRVar8;
  Opnd *src2Opnd;
  ProfiledInstr *instr;
  IntConstOpnd *src1Opnd;
  JitProfilingInstr *instr_00;
  JITTimeFunctionBody *this_00;
  JITTimeProfileInfo *this_01;
  ArrayCallSiteInfo *pAVar9;
  int iVar10;
  undefined6 in_register_00000032;
  undefined2 in_register_0000008a;
  uint uVar11;
  ProfileId index;
  TypeId typeId;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_44;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3e;
  uint local_3c;
  uint local_38;
  OpCode local_32 [4];
  OpCode newOpcode_local;
  
  uVar11 = CONCAT22(in_register_0000008a,profileId);
  iVar10 = (int)CONCAT62(in_register_00000032,newOpcode);
  local_3c = C1;
  local_32[0] = newOpcode;
  if ((iVar10 != 0xd0) && (iVar10 != 0xe5)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0xb94,
                       "(newOpcode == Js::OpCode::ProfiledNewScArray || newOpcode == Js::OpCode::ProfiledInitForInEnumerator)"
                       ,
                       "newOpcode == Js::OpCode::ProfiledNewScArray || newOpcode == Js::OpCode::ProfiledInitForInEnumerator"
                      );
    if (!bVar4) goto LAB_004cdb3a;
    *puVar7 = 0;
  }
  Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(local_32);
  if (local_32[0] == InitForInEnumerator) {
    pRVar8 = BuildSrcOpnd(this,R0,TyVar);
    src2Opnd = BuildForInEnumeratorOpnd(this,local_3c,offset);
    instr = IR::ProfiledInstr::New
                      (InitForInEnumerator,(Opnd *)0x0,&pRVar8->super_Opnd,src2Opnd,this->m_func);
    if ((instr->super_Instr).m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar4) goto LAB_004cdb3a;
      *puVar7 = 0;
    }
    *(uint *)&instr->u = (uint)profileId;
    AddInstr(this,&instr->super_Instr,offset);
    return;
  }
  pRVar8 = BuildDstOpnd(this,R0,TyVar,false,false);
  pSVar2 = pRVar8->m_sym;
  src1Opnd = IR::IntConstOpnd::New((long)(int)local_3c,TyInt32,this->m_func,false);
  bVar4 = Func::DoSimpleJitDynamicProfile(this->m_func);
  if (bVar4) {
    instr_00 = IR::JitProfilingInstr::New
                         (local_32[0],&pRVar8->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
    if ((instr_00->super_Instr).m_kind != InstrKindJitProfiling) {
      AssertCount = AssertCount + 1;
      local_38 = uVar11;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,199,"(this->IsJitProfilingInstr())","Bad call to AsProfiledInstr()");
      if (!bVar4) {
LAB_004cdb3a:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
      uVar11 = local_38;
    }
    index = (ProfileId)uVar11;
    instr_00->profileId = index;
  }
  else {
    instr_00 = (JitProfilingInstr *)
               IR::ProfiledInstr::New
                         (local_32[0],&pRVar8->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
    if ((instr_00->super_Instr).m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      local_38 = uVar11;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar4) goto LAB_004cdb3a;
      *puVar7 = 0;
      uVar11 = local_38;
    }
    index = (ProfileId)uVar11;
    instr_00->profileId = (short)(uVar11 & 0xffff);
    instr_00->arrayProfileId = (short)((uVar11 & 0xffff) >> 0x10);
  }
  AddInstr(this,&instr_00->super_Instr,offset);
  uVar11 = *(uint *)&pSVar2->field_0x18;
  if ((uVar11 & 1) != 0) {
    *(uint *)&pSVar2->field_0x18 = uVar11 | 6;
  }
  bVar4 = Func::HasArrayInfo(this->m_func);
  typeId = TypeIds_Array;
  if (bVar4) {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    this_01 = JITTimeFunctionBody::GetReadOnlyProfileInfo(this_00);
    pAVar9 = JITTimeProfileInfo::GetArrayCallSiteInfo(this_01,index);
    if (((pAVar9 != (ArrayCallSiteInfo *)0x0) &&
        (bVar4 = Func::IsJitInDebugMode(this->m_func), !bVar4)) &&
       (bVar4 = Js::JavascriptArray::HasInlineHeadSegment(local_3c), bVar4)) {
      bVar5 = (pAVar9->field_0).bits;
      if ((bVar5 & 1) == 0) {
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase);
        typeId = TypeIds_NativeIntArray;
        if (!bVar4) goto LAB_004cdac3;
        bVar5 = (pAVar9->field_0).bits;
      }
      typeId = TypeIds_Array;
      if ((bVar5 & 2) == 0) {
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase);
        typeId = (uint)!bVar4 + (uint)!bVar4 * 2 + TypeIds_Array;
      }
    }
  }
LAB_004cdac3:
  local_42.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::GetObject(Array);
  local_44.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::SetHasNoMissingValues((ValueType *)&local_42.field_0,true);
  VVar6 = ValueType::SetArrayTypeId((ValueType *)&local_44.field_0,typeId);
  IR::Opnd::SetValueType(&pRVar8->super_Opnd,VVar6);
  local_40 = (pRVar8->super_Opnd).m_valueType.field_0;
  bVar4 = ValueType::HasVarElements((ValueType *)&local_40.field_0);
  if (bVar4) {
    puVar1 = &(pRVar8->super_Opnd).field_0xb;
    *puVar1 = *puVar1 | 1;
  }
  else {
    local_3e = (pRVar8->super_Opnd).m_valueType.field_0;
    VVar6 = ValueType::ToLikely((ValueType *)&local_3e.field_0);
    IR::Opnd::SetValueType(&pRVar8->super_Opnd,VVar6);
  }
  return;
}

Assistant:

void
IRBuilder::BuildProfiledReg1Unsigned1(Js::OpCode newOpcode, uint32 offset, Js::RegSlot R0, int32 C1, Js::ProfileId profileId)
{
    Assert(newOpcode == Js::OpCode::ProfiledNewScArray || newOpcode == Js::OpCode::ProfiledInitForInEnumerator);
    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(newOpcode);

    if (newOpcode == Js::OpCode::InitForInEnumerator)
    {
        IR::RegOpnd * src1Opnd = this->BuildSrcOpnd(R0);
        IR::Opnd * src2Opnd = this->BuildForInEnumeratorOpnd(C1, offset);
        IR::Instr *instr = IR::ProfiledInstr::New(Js::OpCode::InitForInEnumerator, nullptr, src1Opnd, src2Opnd, m_func);
        instr->AsProfiledInstr()->u.profileId = profileId;
        this->AddInstr(instr, offset);
        return;
    }

    IR::Instr *instr;
    Js::RegSlot     dstRegSlot = R0;
    IR::RegOpnd *   dstOpnd = this->BuildDstOpnd(dstRegSlot);

    StackSym *      dstSym = dstOpnd->m_sym;
    int32           value = C1;
    IR::IntConstOpnd * srcOpnd;

    srcOpnd = IR::IntConstOpnd::New(value, TyInt32, m_func);
    if (m_func->DoSimpleJitDynamicProfile())
    {
        instr = IR::JitProfilingInstr::New(newOpcode, dstOpnd, srcOpnd, m_func);
        instr->AsJitProfilingInstr()->profileId = profileId;
    }
    else
    {
        instr = IR::ProfiledInstr::New(newOpcode, dstOpnd, srcOpnd, m_func);
        instr->AsProfiledInstr()->u.profileId = profileId;
    }

    this->AddInstr(instr, offset);

    if (dstSym->m_isSingleDef)
    {
        dstSym->m_isSafeThis = true;
        dstSym->m_isNotNumber = true;
    }

    // Undefined values in array literals ([0, undefined, 1]) are treated as missing values in some versions
    Js::ArrayCallSiteInfo *arrayInfo = nullptr;
    if (m_func->HasArrayInfo())
    {
        arrayInfo = m_func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfo(profileId);
    }
    Js::TypeId arrayTypeId = Js::TypeIds_Array;
    if (arrayInfo && !m_func->IsJitInDebugMode() && Js::JavascriptArray::HasInlineHeadSegment(value))
    {
        if (arrayInfo->IsNativeIntArray())
        {
            arrayTypeId = Js::TypeIds_NativeIntArray;
        }
        else if (arrayInfo->IsNativeFloatArray())
        {
            arrayTypeId = Js::TypeIds_NativeFloatArray;
        }
    }
    dstOpnd->SetValueType(ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(true).SetArrayTypeId(arrayTypeId));
    if (dstOpnd->GetValueType().HasVarElements())
    {
        dstOpnd->SetValueTypeFixed();
    }
    else
    {
        dstOpnd->SetValueType(dstOpnd->GetValueType().ToLikely());
    }
}